

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCDisassembler.c
# Opt level: O0

DecodeStatus decodeMemRIOperands(MCInst *Inst,uint64_t Imm,int64_t Address,void *Decoder)

{
  uint uVar1;
  ulong uVar2;
  MCOperand *Op;
  int64_t Val;
  uint64_t Disp;
  uint64_t Base;
  void *Decoder_local;
  int64_t Address_local;
  uint64_t Imm_local;
  MCInst *Inst_local;
  
  uVar2 = Imm >> 0x10;
  uVar1 = MCInst_getOpcode(Inst);
  if (((((uVar1 == 0x24e) || (uVar1 == 0x262)) || (uVar1 == 0x268)) ||
      ((uVar1 == 0x26d || (uVar1 == 0x276)))) || (uVar1 == 0x292)) {
    MCOperand_CreateReg0(Inst,GP0Regs[uVar2]);
  }
  else if (((uVar1 == 0x347) || (uVar1 == 0x354)) ||
          ((uVar1 == 0x359 || ((uVar1 == 0x35f || (uVar1 == 0x370)))))) {
    Op = MCOperand_CreateReg1(Inst,GP0Regs[uVar2]);
    MCInst_insert0(Inst,0,Op);
  }
  Val = SignExtend64(Imm & 0xffff,0x10);
  MCOperand_CreateImm0(Inst,Val);
  MCOperand_CreateReg0(Inst,GP0Regs[uVar2]);
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus decodeMemRIOperands(MCInst *Inst, uint64_t Imm,
		int64_t Address, const void *Decoder)
{
	// Decode the memri field (imm, reg), which has the low 16-bits as the
	// displacement and the next 5 bits as the register #.

	uint64_t Base = Imm >> 16;
	uint64_t Disp = Imm & 0xFFFF;

	// assert(Base < 32 && "Invalid base register");

	switch (MCInst_getOpcode(Inst)) {
		default: break;
		case PPC_LBZU:
		case PPC_LHAU:
		case PPC_LHZU:
		case PPC_LWZU:
		case PPC_LFSU:
		case PPC_LFDU:
				 // Add the tied output operand.
				 MCOperand_CreateReg0(Inst, GP0Regs[Base]);
				 break;
		case PPC_STBU:
		case PPC_STHU:
		case PPC_STWU:
		case PPC_STFSU:
		case PPC_STFDU:
				 MCInst_insert0(Inst, 0, MCOperand_CreateReg1(Inst, GP0Regs[Base]));
				 break;
	}

	MCOperand_CreateImm0(Inst, SignExtend64(Disp, 16));
	MCOperand_CreateReg0(Inst, GP0Regs[Base]);
	return MCDisassembler_Success;
}